

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warehouseapp.cpp
# Opt level: O2

Product * __thiscall WarehouseServer::GetProduct(WarehouseServer *this,string *id)

{
  iterator iVar1;
  mapped_type *pmVar2;
  JsonRpcException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->products)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
             ::operator[](&this->products,id);
    return pmVar2;
  }
  this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  std::operator+(&local_30,"No product listed for id: ",id);
  jsonrpccxx::JsonRpcException::JsonRpcException(this_00,-33000,&local_30);
  __cxa_throw(this_00,&jsonrpccxx::JsonRpcException::typeinfo,
              jsonrpccxx::JsonRpcException::~JsonRpcException);
}

Assistant:

const Product& WarehouseServer::GetProduct(const std::string &id) {
  if (products.find(id) == products.end())
    throw JsonRpcException(-33000, "No product listed for id: " + id);
  return products[id];
}